

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

RPCHelpMan * uptime(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  RPCResult result;
  string description;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  code *pcVar6;
  undefined8 in_stack_fffffffffffffd70;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  undefined1 in_stack_fffffffffffffd90 [16];
  pointer in_stack_fffffffffffffda0;
  pointer pRVar10;
  pointer pRVar11;
  pointer pRVar12;
  _Alloc_hider in_stack_fffffffffffffdc0;
  _Alloc_hider _Var13;
  size_type in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  ulong *local_180;
  undefined8 local_178;
  ulong local_170;
  undefined8 uStack_168;
  ulong *local_160;
  size_type local_158;
  ulong local_150;
  undefined8 uStack_148;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"uptime","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturns the total uptime of the server.\n","");
  local_120[0] = local_110;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"The number of seconds that the server has been running","");
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffd58;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffd60;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffffd90;
  RPCResult::RPCResult
            (&local_100,NUM,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffffd48;
  result.m_key_name._M_string_length = in_stack_fffffffffffffd58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffd60;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffd68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar8;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd90._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffffd90._8_8_;
  result.m_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffda0;
  result.m_description.field_2._8_8_ = pRVar10;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar11;
  result.m_cond._M_string_length = (size_type)pRVar12;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdc0._M_p;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffdc8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffd90,result);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"uptime","");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  HelpExampleCli(&local_1a0,&local_1c0,&local_1e0);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"uptime","");
  _Var13._M_p = &stack0xfffffffffffffdd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdc0,"");
  HelpExampleRpc(&local_200,&local_220,(string *)&stack0xfffffffffffffdc0);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    uVar5 = local_1a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_200._M_string_length + local_1a0._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      uVar5 = local_200.field_2._M_allocated_capacity;
    }
    if (local_200._M_string_length + local_1a0._M_string_length <= (ulong)uVar5) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_200,0,0,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
      goto LAB_00ac239c;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1a0,local_200._M_dataplus._M_p,local_200._M_string_length);
LAB_00ac239c:
  local_180 = &local_170;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_170 = paVar1->_M_allocated_capacity;
    uStack_168 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_170 = paVar1->_M_allocated_capacity;
    local_180 = puVar2;
  }
  local_158 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_180 == &local_170) {
    uStack_148 = uStack_168;
    local_160 = &local_150;
  }
  else {
    local_160 = local_180;
  }
  local_150 = local_170;
  local_178 = 0;
  local_170 = local_170 & 0xffffffffffffff00;
  pcVar6 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:209:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:209:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:209:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar7;
  description.field_2._8_8_ = pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffffd90._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffd90._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_fffffffffffffda0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pRVar11;
  examples.m_examples._M_string_length = (size_type)_Var13._M_p;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffdd0;
  local_180 = &local_170;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffffd58)),description,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffd58,&stack0xfffffffffffffd58,3);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (_Var13._M_p != &stack0xfffffffffffffdd0) {
    operator_delete(_Var13._M_p,in_stack_fffffffffffffdd0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffd90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffd78);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffda8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan uptime()
{
    return RPCHelpMan{"uptime",
                "\nReturns the total uptime of the server.\n",
                            {},
                            RPCResult{
                                RPCResult::Type::NUM, "", "The number of seconds that the server has been running"
                            },
                RPCExamples{
                    HelpExampleCli("uptime", "")
                + HelpExampleRpc("uptime", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    return GetTime() - GetStartupTime();
}
    };
}